

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQNativeClosure::Finalize(SQNativeClosure *this)

{
  long local_18;
  SQInteger _n_;
  SQNativeClosure *this_local;
  
  for (local_18 = 0; local_18 < (long)this->_noutervalues; local_18 = local_18 + 1) {
    ::SQObjectPtr::Null(this->_outervalues + local_18);
  }
  return;
}

Assistant:

void Finalize() { _NULL_SQOBJECT_VECTOR(_outervalues,_noutervalues); }